

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O3

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseObject<0u,rapidjson::BasicIStreamWrapper<std::istream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  byte bVar1;
  char *pcVar2;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  bool bVar3;
  byte *pbVar4;
  uint count;
  Member *members;
  
  BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
  bVar3 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          ::StartObject(handler);
  if (bVar3) {
    while( true ) {
      pbVar4 = (byte *)is->current_;
      bVar1 = *pbVar4;
      if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) break;
      BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
    }
    if (*(int *)(this + 0x30) != 0) {
      return;
    }
    if (bVar1 == 0x7d) {
      BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
      pcVar2 = (handler->stack_).stackTop_;
      pcVar2[-8] = '\0';
      pcVar2[-7] = '\0';
      pcVar2[-6] = '\0';
      pcVar2[-5] = '\0';
      pcVar2[-4] = '\0';
      pcVar2[-3] = '\0';
      pcVar2[-2] = '\x03';
      pcVar2[-1] = '\0';
      pcVar2[-0x10] = '\0';
      pcVar2[-0xf] = '\0';
      pcVar2[-0xe] = '\0';
      pcVar2[-0xd] = '\0';
      pcVar2[-0xc] = '\0';
      pcVar2[-0xb] = '\0';
      pcVar2[-10] = '\0';
      pcVar2[-9] = '\0';
      return;
    }
    if (bVar1 == 0x22) {
      count = 0;
      do {
        ParseString<0u,rapidjson::BasicIStreamWrapper<std::istream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  (this,is,handler,true);
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        while( true ) {
          bVar1 = *is->current_;
          if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) break;
          BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
        }
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        if (bVar1 != 0x3a) {
          pbVar4 = (byte *)(is->current_ + (is->count_ - (long)is->buffer_));
          *(undefined4 *)(this + 0x30) = 5;
          goto LAB_0011c160;
        }
        do {
          BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
          if (0x20 < (ulong)(byte)*is->current_) break;
        } while ((0x100002600U >> ((ulong)(byte)*is->current_ & 0x3f) & 1) != 0);
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        ParseValue<0u,rapidjson::BasicIStreamWrapper<std::istream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  (this,is,handler);
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        while( true ) {
          bVar1 = *is->current_;
          if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) break;
          BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
        }
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        count = count + 1;
        if (bVar1 != 0x2c) {
          if (bVar1 == 0x7d) {
            BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
            allocator = handler->allocator_;
            pcVar2 = (handler->stack_).stackTop_;
            members = (Member *)(pcVar2 + (ulong)count * -0x20);
            (handler->stack_).stackTop_ = (char *)members;
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::SetObjectRaw((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            *)(pcVar2 + (ulong)count * -0x20 + -0x10),members,count,allocator);
            return;
          }
          pbVar4 = (byte *)(is->current_ + (is->count_ - (long)is->buffer_));
          *(undefined4 *)(this + 0x30) = 6;
          goto LAB_0011c160;
        }
        do {
          BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
          pbVar4 = (byte *)is->current_;
          bVar1 = *pbVar4;
          if (0x20 < (ulong)bVar1) break;
        } while ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) != 0);
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
      } while (bVar1 == 0x22);
    }
    pbVar4 = pbVar4 + (is->count_ - (long)is->buffer_);
    *(undefined4 *)(this + 0x30) = 4;
  }
  else {
    pbVar4 = (byte *)(is->current_ + (is->count_ - (long)is->buffer_));
    *(undefined4 *)(this + 0x30) = 0x10;
  }
LAB_0011c160:
  *(byte **)(this + 0x38) = pbVar4;
  return;
}

Assistant:

void ParseObject(InputStream& is, Handler& handler) {
        RAPIDJSON_ASSERT(is.Peek() == '{');
        is.Take();  // Skip '{'

        if (RAPIDJSON_UNLIKELY(!handler.StartObject()))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());

        SkipWhitespaceAndComments<parseFlags>(is);
        RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

        if (Consume(is, '}')) {
            if (RAPIDJSON_UNLIKELY(!handler.EndObject(0)))  // empty object
                RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
            return;
        }

        for (SizeType memberCount = 0;;) {
            if (RAPIDJSON_UNLIKELY(is.Peek() != '"'))
                RAPIDJSON_PARSE_ERROR(kParseErrorObjectMissName, is.Tell());

            ParseString<parseFlags>(is, handler, true);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            SkipWhitespaceAndComments<parseFlags>(is);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            if (RAPIDJSON_UNLIKELY(!Consume(is, ':')))
                RAPIDJSON_PARSE_ERROR(kParseErrorObjectMissColon, is.Tell());

            SkipWhitespaceAndComments<parseFlags>(is);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            ParseValue<parseFlags>(is, handler);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            SkipWhitespaceAndComments<parseFlags>(is);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            ++memberCount;

            switch (is.Peek()) {
                case ',':
                    is.Take();
                    SkipWhitespaceAndComments<parseFlags>(is);
                    RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
                    break;
                case '}':
                    is.Take();
                    if (RAPIDJSON_UNLIKELY(!handler.EndObject(memberCount)))
                        RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
                    return;
                default:
                    RAPIDJSON_PARSE_ERROR(kParseErrorObjectMissCommaOrCurlyBracket, is.Tell()); break; // This useless break is only for making warning and coverage happy
            }

            if (parseFlags & kParseTrailingCommasFlag) {
                if (is.Peek() == '}') {
                    if (RAPIDJSON_UNLIKELY(!handler.EndObject(memberCount)))
                        RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
                    is.Take();
                    return;
                }
            }
        }
    }